

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O2

SingleKdTreeIndex * __thiscall
CoreML::Specification::SingleKdTreeIndex::New(SingleKdTreeIndex *this,Arena *arena)

{
  SingleKdTreeIndex *this_00;
  
  this_00 = (SingleKdTreeIndex *)operator_new(0x18);
  SingleKdTreeIndex(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::SingleKdTreeIndex>(arena,this_00);
  }
  return this_00;
}

Assistant:

SingleKdTreeIndex* SingleKdTreeIndex::New(::google::protobuf::Arena* arena) const {
  SingleKdTreeIndex* n = new SingleKdTreeIndex;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}